

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall libtorrent::socks5::on_connected(socks5 *this,error_code *e)

{
  target_fns *ptVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> lhs;
  bool bVar2;
  ulong uVar3;
  pointer data;
  pointer pvVar4;
  unsigned_long size_in_bytes;
  undefined1 local_88 [64];
  mutable_buffer local_48;
  target_fns *local_38;
  char *p;
  error_code local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  error_code *e_local;
  socks5 *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)e;
  e_local = (error_code *)this;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::cancel(&this->m_timer);
  lhs._M_pi = local_18._M_pi;
  boost::system::error_code::error_code<boost::asio::error::basic_errors>
            (&local_28,operation_aborted,(type *)0x0);
  bVar2 = boost::system::operator==((error_code *)lhs._M_pi,&local_28);
  if ((!bVar2) && ((this->m_abort & 1U) == 0)) {
    bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_18._M_pi);
    if (bVar2) {
      bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
      if (bVar2) {
        p._7_1_ = 0x10;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,(operation_t *)((long)&p + 7),
                   (error_code *)local_18._M_pi);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else {
      local_38 = (target_fns *)std::array<char,_270UL>::data(&this->m_tmp_buf);
      detail::write_uint8<int,char*>(5,(char **)&local_38);
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) == 0) && ((this->m_proxy_settings).type != socks5)) {
        detail::write_uint8<int,char*>(2,(char **)&local_38);
        detail::write_uint8<int,char*>(0,(char **)&local_38);
        detail::write_uint8<int,char*>(2,(char **)&local_38);
      }
      else {
        detail::write_uint8<int,char*>(1,(char **)&local_38);
        detail::write_uint8<int,char*>(0,(char **)&local_38);
      }
      data = std::array<char,_270UL>::data(&this->m_tmp_buf);
      ptVar1 = local_38;
      pvVar4 = std::array<char,_270UL>::data(&this->m_tmp_buf);
      size_in_bytes =
           libtorrent::aux::numeric_cast<unsigned_long,long,void>((long)ptVar1 - (long)pvVar4);
      local_48 = (mutable_buffer)boost::asio::buffer(data,size_in_bytes);
      local_88._16_8_ = handshake1;
      local_88._24_4_ = 0;
      local_88[0x1c] = '\0';
      local_88._29_3_ = 0;
      self((socks5 *)local_88);
      std::
      bind<void(libtorrent::socks5::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::socks5>,std::_Placeholder<1>const&>
                ((type *)(local_88 + 0x20),(offset_in_socks5_to_subr *)(local_88 + 0x10),
                 (shared_ptr<libtorrent::socks5> *)local_88,
                 (_Placeholder<1> *)&std::placeholders::_1);
      boost::asio::
      async_write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,std::_Bind<void(libtorrent::socks5::*(std::shared_ptr<libtorrent::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                (&this->m_socks5_sock,(mutable_buffers_1 *)&local_48,
                 (_Bind<void_(libtorrent::socks5::*(std::shared_ptr<libtorrent::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                  *)(local_88 + 0x20),(type *)0x0);
      std::
      _Bind<void_(libtorrent::socks5::*(std::shared_ptr<libtorrent::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
      ::~_Bind((_Bind<void_(libtorrent::socks5::*(std::shared_ptr<libtorrent::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                *)(local_88 + 0x20));
      std::shared_ptr<libtorrent::socks5>::~shared_ptr((shared_ptr<libtorrent::socks5> *)local_88);
    }
  }
  return;
}

Assistant:

void socks5::on_connected(error_code const& e)
{
	COMPLETE_ASYNC("socks5::on_connected");

	m_timer.cancel();

	if (e == boost::asio::error::operation_aborted) return;

	if (m_abort) return;

	// we failed to connect to the proxy
	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::connect, e);
		++m_failures;
		retry_connection();
		return;
	}

	using namespace libtorrent::detail;

	// send SOCKS5 authentication methods
	char* p = m_tmp_buf.data();
	write_uint8(5, p); // SOCKS VERSION 5
	if (m_proxy_settings.username.empty()
		|| m_proxy_settings.type == settings_pack::socks5)
	{
		write_uint8(1, p); // 1 authentication method (no auth)
		write_uint8(0, p); // no authentication
	}
	else
	{
		write_uint8(2, p); // 2 authentication methods
		write_uint8(0, p); // no authentication
		write_uint8(2, p); // username/password
	}
	TORRENT_ASSERT_VAL(p - m_tmp_buf.data() < int(m_tmp_buf.size()), (p - m_tmp_buf.data()));
	ADD_OUTSTANDING_ASYNC("socks5::on_handshake1");
	boost::asio::async_write(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data()
		, aux::numeric_cast<std::size_t>(p - m_tmp_buf.data()))
		, std::bind(&socks5::handshake1, self(), _1));
}